

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O3

char * getquoted(void)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  
  skip();
  if (*s == '\"') {
    pcVar3 = s + 2;
    lVar4 = 0;
    pcVar2 = getquoted::buffer;
    s = s + 1;
    do {
      pcVar5 = getquoted::buffer + lVar4;
      cVar1 = pcVar3[-1];
      if (cVar1 == '\0') goto LAB_00114ab0;
      s = pcVar3;
      if (cVar1 == '\"') goto LAB_00114ab0;
      if (cVar1 == '\n') {
        line = line + 1;
        goto LAB_00114ab0;
      }
      getquoted::buffer[lVar4] = cVar1;
      lVar4 = lVar4 + 1;
      pcVar3 = pcVar3 + 1;
    } while (lVar4 != 0xff);
    pcVar5 = getquoted::buffer + 0xff;
LAB_00114ab0:
    *pcVar5 = '\0';
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

char *getquoted(void)
/* return characters between "quotes" */
{
  skip();
  if (*s == '\"') {
    static char buffer[MAXLEN];
    char c,*bp=buffer;

    s++;

    while (c = *s) {
      s++;

      if (c == '\n') {
        line++;
        break;  /* @@@ newline breaks string? */
      }
      else if (c == '\"')
        break;

      *bp++ = c;
      if (bp >= &buffer[MAXLEN-1])
        break;  /* buffer overflow */
    }
    *bp = '\0';
    return buffer;
  }

  return NULL;
}